

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_(CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  size_t sVar5;
  bool *pbVar6;
  uint *puVar7;
  size_type sVar8;
  char *pcVar9;
  CompilerError *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  allocator local_d8;
  allocator local_d7;
  allocator local_d6;
  allocator local_d5;
  allocator local_d4;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  allocator local_d0;
  allocator local_cf;
  allocator local_ce;
  allocator local_cd;
  allocator local_cc;
  allocator local_cb;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [37];
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  spirv_cross local_80 [48];
  spirv_cross local_50 [32];
  ulong local_30;
  size_t i;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *name;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,id);
  type_local = type;
  this_local = this;
  if ((((pSStack_20->pointer & 1U) == 0) ||
      (pSStack_20->storage != StorageClassPhysicalStorageBuffer)) ||
     (*(int *)&(pSStack_20->super_IVariant).field_0xc == 0xf)) {
    switch(*(undefined4 *)&(pSStack_20->super_IVariant).field_0xc) {
    case 1:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"void",&local_a3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a3);
      break;
    default:
      if ((*(int *)&(pSStack_20->super_IVariant).field_0xc == 8) &&
         (bVar2 = is_legacy((CompilerGLSL *)type), bVar2)) {
        local_ca = 1;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c8,"Unsigned integers are not supported on legacy targets.",&local_c9);
        CompilerError::CompilerError(this_00,(string *)local_c8);
        local_ca = 0;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((pSStack_20->vecsize == 1) && (pSStack_20->columns == 1)) {
        switch(*(undefined4 *)&(pSStack_20->super_IVariant).field_0xc) {
        case 2:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"bool",&local_cb);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_cb);
          break;
        case 3:
          pcVar9 = (char *)type[0x18].array.super_VectorView<unsigned_int>.buffer_size;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,pcVar9,&local_cc);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_cc);
          break;
        case 4:
          pcVar9 = (char *)type[0x18].array.buffer_capacity;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,pcVar9,&local_cd);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_cd);
          break;
        case 5:
          pcVar9 = *(char **)type[0x18].array.stack_storage.aligned_char;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,pcVar9,&local_ce);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ce);
          break;
        case 6:
          pcVar9 = *(char **)(type[0x18].array.stack_storage.aligned_char + 8);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,pcVar9,&local_cf);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_cf);
          break;
        case 7:
          pcVar9 = *(char **)&type[0x18].columns;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,pcVar9,&local_d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d0);
          break;
        case 8:
          puVar7 = type[0x18].array.super_VectorView<unsigned_int>.ptr;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,(char *)puVar7,&local_d1);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          break;
        case 9:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"int64_t",&local_d6);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d6);
          break;
        case 10:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"uint64_t",&local_d7);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d7);
          break;
        case 0xb:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"atomic_uint",&local_d2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d2);
          break;
        case 0xc:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"float16_t",&local_d3);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d3);
          break;
        case 0xd:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"float",&local_d4);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d4);
          break;
        case 0xe:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"double",&local_d5);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d5);
          break;
        default:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"???",&local_d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d8);
        }
      }
      else if ((pSStack_20->vecsize < 2) || (pSStack_20->columns != 1)) {
        if (pSStack_20->vecsize == pSStack_20->columns) {
          switch(*(undefined4 *)&(pSStack_20->super_IVariant).field_0xc) {
          case 2:
            join<char_const(&)[5],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"bmat",&pSStack_20->vecsize);
            break;
          default:
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"???",&local_da);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_da);
            break;
          case 7:
            join<char_const(&)[5],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"imat",&pSStack_20->vecsize);
            break;
          case 8:
            join<char_const(&)[5],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"umat",&pSStack_20->vecsize);
            break;
          case 0xc:
            join<char_const(&)[7],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [7])"f16mat",&pSStack_20->vecsize);
            break;
          case 0xd:
            join<char_const(&)[4],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [4])0x4dfde6,&pSStack_20->vecsize);
            break;
          case 0xe:
            join<char_const(&)[5],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"dmat",&pSStack_20->vecsize);
          }
        }
        else {
          switch(*(undefined4 *)&(pSStack_20->super_IVariant).field_0xc) {
          case 2:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"bmat",&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
            break;
          default:
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"???",&local_db);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_db);
            break;
          case 7:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"imat",&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
            break;
          case 8:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"umat",&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
            break;
          case 0xc:
            join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [7])"f16mat",&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
            break;
          case 0xd:
            join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [4])0x4dfde6,&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
            break;
          case 0xe:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      ((spirv_cross *)this,(char (*) [5])"dmat",&pSStack_20->columns,
                       (char (*) [2])0x4df009,&pSStack_20->vecsize);
          }
        }
      }
      else {
        switch(*(undefined4 *)&(pSStack_20->super_IVariant).field_0xc) {
        case 2:
          join<char_const(&)[5],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [5])"bvec",&pSStack_20->vecsize);
          break;
        case 3:
          join<char_const(&)[6],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [6])"i8vec",&pSStack_20->vecsize);
          break;
        case 4:
          join<char_const(&)[6],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [6])"u8vec",&pSStack_20->vecsize);
          break;
        case 5:
          join<char_const(&)[7],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [7])"i16vec",&pSStack_20->vecsize);
          break;
        case 6:
          join<char_const(&)[7],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [7])"u16vec",&pSStack_20->vecsize);
          break;
        case 7:
          join<char_const(&)[5],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [5])"ivec",&pSStack_20->vecsize);
          break;
        case 8:
          join<char_const(&)[5],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [5])"uvec",&pSStack_20->vecsize);
          break;
        case 9:
          join<char_const(&)[7],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [7])"i64vec",&pSStack_20->vecsize);
          break;
        case 10:
          join<char_const(&)[7],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [7])"u64vec",&pSStack_20->vecsize);
          break;
        default:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"???",&local_d9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          break;
        case 0xc:
          join<char_const(&)[7],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [7])"f16vec",&pSStack_20->vecsize);
          break;
        case 0xd:
          join<char_const(&)[4],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [4])0x4dfdc9,&pSStack_20->vecsize);
          break;
        case 0xe:
          join<char_const(&)[5],unsigned_int_const&>
                    ((spirv_cross *)this,(char (*) [5])"dvec",&pSStack_20->vecsize);
        }
      }
      break;
    case 0xf:
      if ((type[0x18].array_size_literal.buffer_capacity & 0x1000000) == 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_20->super_IVariant).self);
        (*(type->super_IVariant)._vptr_IVariant[6])(this,type,(ulong)uVar3,1);
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_20->super_IVariant).self);
        (*(type->super_IVariant)._vptr_IVariant[6])(local_a0,type,(ulong)uVar3,1);
        join<char_const(&)[8],std::__cxx11::string>
                  ((spirv_cross *)this,(char (*) [8])"struct ",local_a0);
        ::std::__cxx11::string::~string((string *)local_a0);
      }
      break;
    case 0x10:
    case 0x11:
      (*(type->super_IVariant)._vptr_IVariant[0x17])(this,type,pSStack_20,(ulong)in_ECX);
      break;
    case 0x12:
      sVar8 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)(type[8].array.stack_storage.aligned_char + 0x18),
                      (key_type *)((long)&i + 4));
      pcVar9 = "sampler";
      if (sVar8 != 0) {
        pcVar9 = "samplerShadow";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,pcVar9,&local_a1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      break;
    case 0x13:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"accelerationStructureNV",&local_a2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a2);
    }
  }
  else {
    i._3_1_ = 0;
    pSVar4 = Compiler::get_pointee_type((Compiler *)type,pSStack_20);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,pSVar4,0);
    for (local_30 = 0; uVar1 = local_30,
        sVar5 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>),
        uVar1 < sVar5; local_30 = local_30 + 1) {
      pbVar6 = VectorView<bool>::operator[]
                         (&(pSStack_20->array_size_literal).super_VectorView<bool>,local_30);
      if ((*pbVar6 & 1U) == 0) {
        puVar7 = VectorView<unsigned_int>::operator[]
                           (&(pSStack_20->array).super_VectorView<unsigned_int>,local_30);
        join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                  (local_80,(char (*) [3])0x4f2f48,puVar7,(char (*) [2])0x4e3b4c);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_80);
        ::std::__cxx11::string::~string((string *)local_80);
      }
      else {
        puVar7 = VectorView<unsigned_int>::operator[]
                           (&(pSStack_20->array).super_VectorView<unsigned_int>,local_30);
        join<unsigned_int_const&,char_const(&)[2]>(local_50,puVar7,(char (*) [2])0x4e3b4c);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_50);
        ::std::__cxx11::string::~string((string *)local_50);
      }
    }
    ::std::__cxx11::string::operator+=((string *)this,"Pointer");
  }
  return this;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// Need to create a magic type name which compacts the entire type information.
		string name = type_to_glsl(get_pointee_type(type));
		for (size_t i = 0; i < type.array.size(); i++)
		{
			if (type.array_size_literal[i])
				name += join(type.array[i], "_");
			else
				name += join("id", type.array[i], "_");
		}
		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return "accelerationStructureNV";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}